

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# contexts.h
# Opt level: O1

Result<wasm::Type> * __thiscall
wasm::WATParser::TypeParserCtx<wasm::WATParser::ParseDefsCtx>::makeTupleType
          (Result<wasm::Type> *__return_storage_ptr__,
          TypeParserCtx<wasm::WATParser::ParseDefsCtx> *this,
          vector<wasm::Type,_std::allocator<wasm::Type>_> *types)

{
  vector<wasm::Type,_std::allocator<wasm::Type>_> local_30;
  
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector(&local_30,types);
  wasm::Type::Type((Type *)__return_storage_ptr__,&local_30);
  *(__index_type *)
   ((long)&(__return_storage_ptr__->val).super__Variant_base<wasm::Type,_wasm::Err>.
           super__Move_assign_alias<wasm::Type,_wasm::Err>.
           super__Copy_assign_alias<wasm::Type,_wasm::Err>.
           super__Move_ctor_alias<wasm::Type,_wasm::Err>.
           super__Copy_ctor_alias<wasm::Type,_wasm::Err>.
           super__Variant_storage_alias<wasm::Type,_wasm::Err> + 0x20) = '\0';
  if (local_30.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_30.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_30.super__Vector_base<wasm::Type,_std::allocator<wasm::Type>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<TypeT> makeTupleType(const std::vector<Type>& types) {
    return Tuple(types);
  }